

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::MatchLiteralNode::AnnotatePass3
          (MatchLiteralNode *this,Compiler *compiler,CountDomain accumConsumes,
          CharSet<char16_t> *accumFollow,bool accumFollowIrrefutable,bool accumFollowEOL)

{
  bool accumFollowEOL_local;
  bool accumFollowIrrefutable_local;
  CharSet<char16_t> *accumFollow_local;
  Compiler *compiler_local;
  MatchLiteralNode *this_local;
  CountDomain accumConsumes_local;
  
  (this->super_Node).followConsumes = accumConsumes;
  (this->super_Node).followSet = accumFollow;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffffb | (uint)accumFollowIrrefutable << 2;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffeff | (uint)accumFollowEOL << 8;
  return;
}

Assistant:

void MatchLiteralNode::AnnotatePass3(Compiler& compiler, CountDomain accumConsumes, CharSet<Char>* accumFollow, bool accumFollowIrrefutable, bool accumFollowEOL)
    {
        followConsumes = accumConsumes;
        followSet = accumFollow;
        isFollowIrrefutable = accumFollowIrrefutable;
        isFollowEOL = accumFollowEOL;
    }